

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump_pretty
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *os,basic_json_encode_options<char> *options)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  error_code ec;
  error_code *in_stack_00000288;
  basic_json_encode_options<char> *in_stack_00000290;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000298;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000002a0;
  undefined8 in_stack_ffffffffffffffd8;
  ser_error *in_stack_ffffffffffffffe0;
  
  std::error_code::error_code(in_RDI);
  dump_pretty(in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = (error_category *)in_stack_ffffffffffffffe0;
  ec_00._M_value = (int)in_stack_ffffffffffffffd8;
  ec_00._4_4_ = SUB84(in_stack_ffffffffffffffd8,4);
  ser_error::ser_error(in_stack_ffffffffffffffe0,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void dump_pretty(std::basic_ostream<char_type>& os, 
            const basic_json_encode_options<char_type>& options = basic_json_options<CharT>()) const
        {
            std::error_code ec;
            dump_pretty(os, options, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec));
            }
        }